

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.hpp
# Opt level: O0

string * __thiscall
I18N::Format<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string>
          (string *__return_storage_ptr__,I18N *this,string *id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<util::variant> __l;
  variant *local_160;
  allocator<util::variant> local_135 [13];
  variant *local_128;
  variant local_120;
  variant local_e0;
  variant local_a0;
  iterator local_60;
  double local_58;
  undefined1 local_50 [8];
  vector<util::variant,_std::allocator<util::variant>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *id_local;
  I18N *this_local;
  
  local_128 = &local_120;
  v.super__Vector_base<util::variant,_std::allocator<util::variant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)args_2;
  util::variant::variant(local_128,args);
  local_128 = &local_e0;
  util::variant::variant(local_128,args_1);
  local_128 = &local_a0;
  util::variant::variant
            (local_128,
             (string *)
             v.super__Vector_base<util::variant,_std::allocator<util::variant>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_60 = &local_120;
  local_58 = 1.48219693752374e-323;
  std::allocator<util::variant>::allocator(local_135);
  __l._M_len = (size_type)local_58;
  __l._M_array = local_60;
  std::vector<util::variant,_std::allocator<util::variant>_>::vector
            ((vector<util::variant,_std::allocator<util::variant>_> *)local_50,__l,local_135);
  std::allocator<util::variant>::~allocator(local_135);
  local_160 = (variant *)&local_60;
  do {
    local_160 = local_160 + -1;
    util::variant::~variant(local_160);
  } while (local_160 != &local_120);
  FormatV(__return_storage_ptr__,this,id,
          (vector<util::variant,_std::allocator<util::variant>_> *)local_50);
  std::vector<util::variant,_std::allocator<util::variant>_>::~vector
            ((vector<util::variant,_std::allocator<util::variant>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& id, Args&&... args) const
		{
			std::vector<util::variant> v{args...};
			return FormatV(id, std::move(v));
		}